

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void sha512_done(sha512_ctx *ctx,sha512 *res)

{
  beint64_t bVar1;
  ulong local_30;
  size_t i;
  uint64_t sizedesc [2];
  sha512 *res_local;
  sha512_ctx *ctx_local;
  
  sizedesc[1] = (uint64_t)res;
  memset(&i,0,0x10);
  sizedesc[0] = cpu_to_be64(ctx->bytes << 3);
  add(ctx,sha512_done::pad,(0xef - (ctx->bytes & 0x7f) & 0x7f) + 1);
  add(ctx,&i,0x10);
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    bVar1 = cpu_to_be64(ctx->s[local_30]);
    *(beint64_t *)(sizedesc[1] + local_30 * 8) = bVar1;
  }
  invalidate_sha512(ctx);
  return;
}

Assistant:

void sha512_done(struct sha512_ctx *ctx, struct sha512 *res)
{
	static const unsigned char pad[128] = { 0x80 };
	uint64_t sizedesc[2] = { 0, 0 };
	size_t i;

	sizedesc[1] = cpu_to_be64((uint64_t)ctx->bytes << 3);

	/* Add '1' bit to terminate, then all 0 bits, up to next block - 16. */
	add(ctx, pad, 1 + ((256 - 16 - (ctx->bytes % 128) - 1) % 128));
	/* Add number of bits of data (big endian) */
	add(ctx, sizedesc, sizeof(sizedesc));
	for (i = 0; i < sizeof(ctx->s) / sizeof(ctx->s[0]); i++)
		res->u.u64[i] = cpu_to_be64(ctx->s[i]);
	invalidate_sha512(ctx);
}